

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_test.cc
# Opt level: O1

void __thiscall
visitor_test_should_parse_utc_time_with_microseconds_Test::TestBody
          (visitor_test_should_parse_utc_time_with_microseconds_Test *this)

{
  _Optional_payload_base<int> _Var1;
  char *pcVar2;
  bool bVar3;
  undefined1 auStack_88 [8];
  tm tm;
  Time time;
  time_t t;
  AssertionResult gtest_ar;
  _Storage<int,_true> local_18;
  bool bStack_14;
  undefined3 uStack_13;
  
  Fixpp::details::LexicalCast<Fixpp::Type::UTCTimeOnly>::cast
            ((Time *)&tm.tm_zone,"14:09:30.125456",0xf);
  time.m_usec.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)tm.tm_zone;
  tm.tm_wday = 0;
  tm.tm_yday = 0;
  tm.tm_isdst = 0;
  tm._36_4_ = 0;
  tm.tm_hour = 0;
  tm.tm_mday = 0;
  tm.tm_mon = 0;
  tm.tm_year = 0;
  auStack_88._0_4_ = 0;
  auStack_88._4_4_ = 0;
  tm.tm_sec = 0;
  tm.tm_min = 0;
  tm.tm_gmtoff = 0;
  gmtime_r((time_t *)&time.m_usec,(tm *)auStack_88);
  _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,0xe);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&t,"tm.tm_hour","14",&tm.tm_sec,&local_18._M_value);
  if ((char)t == '\0') {
    testing::Message::Message((Message *)&local_18);
    if (gtest_ar._0_8_ == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
               ,0x27a,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    if (_local_18 != (_Optional_payload_base<int>)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
        (**(code **)(*(long *)_local_18 + 8))();
      }
      _local_18 = (_Optional_payload_base<int>)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,9);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&t,"tm.tm_min","9",(int *)(auStack_88 + 4),&local_18._M_value);
    if ((char)t == '\0') {
      testing::Message::Message((Message *)&local_18);
      if (gtest_ar._0_8_ == 0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                 ,0x27b,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
      if (_local_18 != (_Optional_payload_base<int>)0x0) {
        bVar3 = testing::internal::IsTrue(true);
        if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
          (**(code **)(*(long *)_local_18 + 8))();
        }
        _local_18 = (_Optional_payload_base<int>)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      _local_18 = (_Optional_payload_base<int>)CONCAT44(_bStack_14,0x1e);
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&t,"tm.tm_sec","30",(int *)auStack_88,&local_18._M_value);
      if ((char)t == '\0') {
        testing::Message::Message((Message *)&local_18);
        if (gtest_ar._0_8_ == 0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                   ,0x27c,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
        if (_local_18 != (_Optional_payload_base<int>)0x0) {
          bVar3 = testing::internal::IsTrue(true);
          if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
            (**(code **)(*(long *)_local_18 + 8))();
          }
          _local_18 = (_Optional_payload_base<int>)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_18 = (_Storage<int,_true>)(undefined4)time.m_time;
        bStack_14 = (bool)time.m_time._4_1_;
        uStack_13 = time.m_time._5_3_;
        _Var1 = _local_18;
        bStack_14 = SUB81((ulong)time.m_time >> 0x20,0);
        bVar3 = bStack_14 == false;
        _local_18 = _Var1;
        if (bVar3) {
LAB_008d2c06:
          std::__throw_bad_optional_access();
        }
        gtest_ar.message_.ptr_._0_4_ = 0x7d;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&t,"time.msec().value()","125",&local_18._M_value,
                   (int *)&gtest_ar.message_);
        if ((char)t == '\0') {
          testing::Message::Message((Message *)&local_18);
          if (gtest_ar._0_8_ == 0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                     ,0x27e,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
          if (_local_18 != (_Optional_payload_base<int>)0x0) {
            bVar3 = testing::internal::IsTrue(true);
            if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
              (**(code **)(*(long *)_local_18 + 8))();
            }
            local_18 = (_Storage<int,_true>)0x0;
            bStack_14 = false;
            uStack_13 = 0;
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
        else {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
          _local_18 = (_Optional_payload_base<int>)
                      time.m_msec.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>;
          _Var1 = _local_18;
          bStack_14 = time.m_msec.super__Optional_base<int,_true,_true>._M_payload.
                      super__Optional_payload_base<int>._M_engaged;
          bVar3 = bStack_14 == false;
          _local_18 = _Var1;
          if (bVar3) goto LAB_008d2c06;
          gtest_ar.message_.ptr_._0_4_ = 0x1c8;
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&t,"time.usec().value()","456",&local_18._M_value,
                     (int *)&gtest_ar.message_);
          if ((char)t == '\0') {
            testing::Message::Message((Message *)&local_18);
            if (gtest_ar._0_8_ == 0) {
              pcVar2 = "";
            }
            else {
              pcVar2 = *(char **)gtest_ar._0_8_;
            }
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/visitor_test.cc"
                       ,0x27f,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar.message_,(Message *)&local_18);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
            if (_local_18 != (_Optional_payload_base<int>)0x0) {
              bVar3 = testing::internal::IsTrue(true);
              if ((bVar3) && (_local_18 != (_Optional_payload_base<int>)0x0)) {
                (**(code **)(*(long *)_local_18 + 8))();
              }
              local_18 = (_Storage<int,_true>)0x0;
              bStack_14 = false;
              uStack_13 = 0;
            }
          }
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(visitor_test, should_parse_utc_time_with_microseconds)
{
    const char* str = "14:09:30.125456";
    auto time = Fixpp::details::LexicalCast<Fixpp::Type::UTCTimeOnly>::cast(str, std::strlen(str));

    auto t = time.time();
    std::tm tm{};
    gmtime_r(&t, &tm);

    ASSERT_EQ(tm.tm_hour, 14);
    ASSERT_EQ(tm.tm_min, 9);
    ASSERT_EQ(tm.tm_sec, 30);

    ASSERT_EQ(time.msec().value(), 125);
    ASSERT_EQ(time.usec().value(), 456);
}